

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurrentThread.cpp
# Opt level: O1

string * __thiscall
sznet::CurrentThread::stackTrace_abi_cxx11_
          (string *__return_storage_ptr__,CurrentThread *this,bool demangle)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  void *pvVar4;
  undefined7 in_register_00000011;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  void *__ptr;
  size_t sVar10;
  bool bVar11;
  undefined1 local_6b8 [8];
  void *frame [200];
  undefined8 local_70;
  size_t len;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  uint local_54;
  void *local_50;
  void *local_48;
  int local_3c;
  string *psStack_38;
  int status;
  
  uVar5 = (ulong)this & 0xffffffff;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  psStack_38 = __return_storage_ptr__;
  uVar2 = backtrace(local_6b8,200,CONCAT71(in_register_00000011,demangle));
  local_50 = (void *)backtrace_symbols(local_6b8,uVar2);
  if (local_50 != (void *)0x0) {
    local_70 = 0x100;
    if ((char)uVar5 == '\0') {
      local_48 = (void *)0x0;
    }
    else {
      local_48 = malloc(0x100);
    }
    __ptr = local_50;
    if (1 < (int)uVar2) {
      len = (size_t)uVar2;
      sVar10 = 1;
      local_54 = (uint)this;
      local_60 = &__return_storage_ptr__->field_2;
      do {
        if ((char)uVar5 == '\0') {
LAB_00122f83:
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
        }
        else {
          pcVar6 = (char *)0x0;
          pcVar8 = (char *)0x0;
          for (pcVar3 = *(char **)((long)__ptr + sVar10 * 8);
              ((cVar1 = *pcVar3, pcVar7 = pcVar3, pcVar9 = pcVar8, cVar1 == '(' ||
               (pcVar7 = pcVar6, pcVar9 = pcVar3, cVar1 == '+')) || (pcVar9 = pcVar8, cVar1 != '\0')
              ); pcVar3 = pcVar3 + 1) {
            pcVar6 = pcVar7;
            pcVar8 = pcVar9;
          }
          bVar11 = true;
          if (pcVar6 != (char *)0x0 && pcVar8 != (char *)0x0) {
            *pcVar8 = '\0';
            local_3c = 0;
            pvVar4 = (void *)__cxa_demangle(pcVar6 + 1,local_48,&local_70,&local_3c);
            *pcVar8 = '+';
            bVar11 = local_3c != 0;
            __ptr = local_50;
            if (!bVar11) {
              std::__cxx11::string::replace
                        ((ulong)psStack_38,psStack_38->_M_string_length,(char *)0x0,
                         *(ulong *)((long)local_50 + sVar10 * 8));
              std::__cxx11::string::append((char *)psStack_38);
              std::__cxx11::string::append((char *)psStack_38);
              std::__cxx11::string::push_back((char)psStack_38);
              __ptr = local_50;
              local_48 = pvVar4;
            }
          }
          uVar5 = (ulong)local_54;
          __return_storage_ptr__ = psStack_38;
          if (bVar11) goto LAB_00122f83;
        }
        sVar10 = sVar10 + 1;
      } while (sVar10 != len);
    }
    free(local_48);
    free(__ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

string stackTrace(bool demangle)
{
	string stack;
	const int max_frames = 200;
	void* frame[max_frames];
	// 该函数用于获取当前线程的调用堆栈,获取的信息将会被存放在buffer中,它是一个指针列表
	int nptrs = ::backtrace(frame, max_frames);
	// backtrace_symbols将从backtrace函数获取的信息转化为一个字符串数组
	char** strings = ::backtrace_symbols(frame, nptrs);
	if (strings)
	{
		size_t len = 256;
		char* demangled = demangle ? static_cast<char*>(::malloc(len)) : nullptr;
		for (int i = 1; i < nptrs; ++i)  // skipping the 0-th, which is this function
		{
			if (demangle)
			{
				// https://panthema.net/2008/0901-stacktrace-demangled/
				// bin/exception_test(_ZN3Bar4testEv+0x79) [0x401909]
				char* left_par = nullptr;
				char* plus = nullptr;
				for (char* p = strings[i]; *p; ++p)
				{
					if (*p == '(')
						left_par = p;
					else if (*p == '+')
						plus = p;
				}

				if (left_par && plus)
				{
					*plus = '\0';
					int status = 0;
					char* ret = abi::__cxa_demangle(left_par + 1, demangled, &len, &status);
					*plus = '+';
					if (status == 0)
					{
						demangled = ret;  // ret could be realloc()
						stack.append(strings[i], left_par + 1);
						stack.append(demangled);
						stack.append(plus);
						stack.push_back('\n');
						continue;
					}
				}
			}
			// Fallback to mangled names
			stack.append(strings[i]);
			stack.push_back('\n');
		}
		free(demangled);
		free(strings);
	}
	return stack;
}